

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O1

void * isotree_deserialize_from_raw(char *serialized_model,int nthreads)

{
  undefined8 uVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  ExtIsoForest *pEVar6;
  unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_> uVar7;
  pointer pvVar8;
  pointer pvVar9;
  long lVar10;
  __uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
  this;
  ExtIsoForest *pEVar11;
  Imputer *pIVar12;
  runtime_error *prVar13;
  char *optional_metadata;
  NewCategAction *pNVar14;
  bool bVar15;
  bool has_combined_objects;
  bool is_compatible;
  bool is_isotree_model;
  bool has_metadata;
  bool has_Indexer;
  bool has_Imputer;
  bool has_ExtIsoForest;
  bool has_IsoForest;
  char *local_198;
  unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_> out;
  TreesIndexer local_188;
  int local_164;
  size_t size_metadata;
  Imputer local_158;
  ExtIsoForest local_e8;
  ExtIsoForest local_98;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> local_48;
  
  if (serialized_model == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Passed NULL \'serialized_model\' to \'isotree_deserialize_from_raw\'.",0x41);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    return (void *)0x0;
  }
  is_isotree_model = false;
  is_compatible = false;
  has_combined_objects = false;
  has_IsoForest = false;
  has_ExtIsoForest = false;
  has_Imputer = false;
  has_Indexer = false;
  has_metadata = false;
  size_metadata = 0;
  inspect_serialized_object
            (serialized_model,&is_isotree_model,&is_compatible,&has_combined_objects,&has_IsoForest,
             &has_ExtIsoForest,&has_Imputer,&has_Indexer,&has_metadata,&size_metadata);
  if (((is_isotree_model == true) && (is_compatible == true)) && (has_combined_objects == false)) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"Serialized model is not compatible.\n");
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98.exp_avg_sep = 0.0;
  local_98.orig_sample_size = 0;
  local_98.missing_action = Fail;
  local_98.scoring_metric = Depth;
  local_98.exp_avg_depth = 0.0;
  local_98.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.new_cat_action = Weighted;
  local_98.cat_split_type = SubSet;
  local_98.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198 = (char *)0x0;
  local_98.has_range_penalty = false;
  local_98._65_7_ = 0;
  local_e8.has_range_penalty = false;
  local_e8._65_7_ = 0;
  local_e8.exp_avg_sep = 0.0;
  local_e8.orig_sample_size = 0;
  local_e8.missing_action = Fail;
  local_e8.scoring_metric = Depth;
  local_e8.exp_avg_depth = 0.0;
  local_e8.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.new_cat_action = Weighted;
  local_e8.cat_split_type = SubSet;
  local_e8.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_158.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_158.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.imputer_tree.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.imputer_tree.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158.imputer_tree.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_158.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_158.ncols_numeric = 0;
  local_158.ncols_categ = 0;
  local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (size_metadata != 0) {
    local_198 = (char *)operator_new__(size_metadata);
  }
  optional_metadata = (char *)size_metadata;
  if (size_metadata != 0) {
    optional_metadata = local_198;
  }
  deserialize_combined
            (serialized_model,(IsoForest *)&local_98,&local_e8,&local_158,&local_188,
             optional_metadata);
  pvVar9 = local_158.imputer_tree.
           super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar8 = local_158.imputer_tree.
           super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)local_98.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_98.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 0) &&
     (local_e8.hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_e8.hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"Error: model contains no trees.\n");
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar15 = local_98.hplanes.
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_98.hplanes.
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)local_98.hplanes.
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_98.hplanes.
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (bVar15) {
    lVar10 = (long)local_e8.hplanes.
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e8.hplanes.
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  }
  local_164 = nthreads;
  if ((local_158.imputer_tree.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       local_158.imputer_tree.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start) ||
     ((long)local_158.imputer_tree.
            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_158.imputer_tree.
            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == lVar10)) {
    if ((local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       (((long)local_188.indices.
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_188.indices.
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5 +
        (lVar10 >> 3) * 0x5555555555555555 == 0)) {
      this.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           (__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
            )operator_new(0x1d8);
      memset((void *)this.
                     super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                     .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl,0,0x1d8)
      ;
      isotree::IsolationForest::IsolationForest
                ((IsolationForest *)
                 this.
                 super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                 .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl);
      *(int *)this.
              super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
              ._M_t.
              super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
              .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl = local_164;
      *(ulong *)((long)this.
                       super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                       .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x10
                ) = (ulong)bVar15 * 2 + 1;
      *(long *)((long)this.
                      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x30)
           = (lVar10 >> 3) * -0x5555555555555555;
      *(bool *)((long)this.
                      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0xa6)
           = pvVar8 != pvVar9;
      out._M_t.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           (__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
            )(__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
              )this.
               super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
               ._M_t.
               super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
               .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
      if (local_98.hplanes.
          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_98.hplanes.
          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pEVar11 = isotree::IsolationForest::get_model_ext
                            ((IsolationForest *)
                             this.
                             super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                             .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl)
        ;
        pEVar6 = &local_e8;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pEVar11->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(pEVar11->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(pEVar11->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pEVar11->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_e8.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pEVar11->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e8.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pEVar11->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_e8.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e8.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ::~vector((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   *)&local_48);
      }
      else {
        pEVar11 = (ExtIsoForest *)
                  isotree::IsolationForest::get_model
                            ((IsolationForest *)
                             this.
                             super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                             .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl)
        ;
        pEVar6 = &local_98;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pEVar11->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(pEVar11->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(pEVar11->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pEVar11->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_98.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pEVar11->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_98.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pEVar11->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_98.hplanes.
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ::~vector((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   *)&local_48);
      }
      pNVar14 = &pEVar6->new_cat_action;
      uVar1 = *(undefined8 *)pNVar14;
      uVar2 = *(undefined8 *)(pNVar14 + 2);
      dVar3 = *(double *)(pNVar14 + 4);
      dVar4 = *(double *)(pNVar14 + 6);
      uVar5 = *(undefined8 *)((long)&pEVar6->orig_sample_size + 1);
      *(undefined8 *)((long)&pEVar11->exp_avg_sep + 1) =
           *(undefined8 *)((long)&pEVar6->exp_avg_sep + 1);
      *(undefined8 *)((long)&pEVar11->orig_sample_size + 1) = uVar5;
      pEVar11->exp_avg_depth = dVar3;
      pEVar11->exp_avg_sep = dVar4;
      *(undefined8 *)&pEVar11->new_cat_action = uVar1;
      *(undefined8 *)&pEVar11->missing_action = uVar2;
      if (local_158.imputer_tree.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_158.imputer_tree.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pIVar12 = isotree::IsolationForest::get_imputer
                            ((IsolationForest *)
                             out._M_t.
                             super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                             .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl)
        ;
        *(undefined4 *)&pIVar12->ncols_numeric = (undefined4)local_158.ncols_numeric;
        *(undefined4 *)((long)&pIVar12->ncols_numeric + 4) = local_158.ncols_numeric._4_4_;
        *(undefined4 *)&pIVar12->ncols_categ = (undefined4)local_158.ncols_categ;
        *(undefined4 *)((long)&pIVar12->ncols_categ + 4) = local_158.ncols_categ._4_4_;
        std::vector<int,_std::allocator<int>_>::_M_move_assign(&pIVar12->ncat,&local_158.ncat);
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pIVar12->imputer_tree).
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(pIVar12->imputer_tree).
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(pIVar12->imputer_tree).
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pIVar12->imputer_tree).
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_158.imputer_tree.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pIVar12->imputer_tree).
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_158.imputer_tree.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pIVar12->imputer_tree).
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_158.imputer_tree.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_158.imputer_tree.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_158.imputer_tree.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_158.imputer_tree.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ::~vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                   *)&local_48);
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&pIVar12->col_means,&local_158.col_means);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&pIVar12->col_modes,&local_158.col_modes);
      }
      if (local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)out._M_t.
                     super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                     .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1b8)
        ;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)out._M_t.
                     super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                     .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1c0)
        ;
        local_48.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)out._M_t.
                     super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                     .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1c8)
        ;
        *(pointer *)
         ((long)out._M_t.
                super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                ._M_t.
                super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1b8) =
             local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)out._M_t.
                super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                ._M_t.
                super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1c0) =
             local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)out._M_t.
                super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                ._M_t.
                super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x1c8) =
             local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_188.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::~vector(&local_48);
      }
      uVar7._M_t.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           out._M_t.
           super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
           ._M_t.
           super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
           .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
      out._M_t.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           (__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
            )(__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
              )0x0;
      std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
      ~unique_ptr(&out);
      if (local_198 != (char *)0x0) {
        operator_delete__(local_198);
      }
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::~vector(&local_188.indices);
      if (local_158.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.col_modes.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.col_modes.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_158.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.col_means.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_158.col_means.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.col_means.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
      ::~vector(&local_158.imputer_tree);
      if (local_158.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ::~vector(&local_e8.hplanes);
      std::
      vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ::~vector((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 *)&local_98);
      return (void *)(__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                      )uVar7._M_t.
                       super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                       .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
    }
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"Error: indexer has incorrect number of trees.\n");
  }
  else {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"Error: imputer has incorrect number of trees.\n");
  }
  __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ISOTREE_EXPORTED
void* isotree_deserialize_from_raw(const char *serialized_model, int nthreads)
{
    if (!serialized_model) {
        cerr << "Passed NULL 'serialized_model' to 'isotree_deserialize_from_raw'." << std::endl;
        return nullptr;
    }

    try
    {
        bool is_isotree_model = false;
        bool is_compatible = false;
        bool has_combined_objects = false;
        bool has_IsoForest = false;
        bool has_ExtIsoForest = false;
        bool has_Imputer = false;
        bool has_Indexer = false;
        bool has_metadata = false;
        size_t size_metadata = 0;
        inspect_serialized_object(
            serialized_model,
            is_isotree_model,
            is_compatible,
            has_combined_objects,
            has_IsoForest,
            has_ExtIsoForest,
            has_Imputer,
            has_Indexer,
            has_metadata,
            size_metadata
        );
        if (is_isotree_model && is_compatible && !has_combined_objects)
            throw std::runtime_error("Serialized model is not compatible.\n");

        IsoForest model = IsoForest();
        ExtIsoForest model_ext = ExtIsoForest();
        Imputer imputer = Imputer();
        TreesIndexer indexer = TreesIndexer();

        std::unique_ptr<char[]> buffer_metadata;
        if (size_metadata) {
            buffer_metadata = std::unique_ptr<char[]>(new char[size_metadata]);
        }

        deserialize_combined(
            serialized_model,
            &model,
            &model_ext,
            &imputer,
            &indexer,
            size_metadata? buffer_metadata.get() : (char*)nullptr
        );

        if (!model.trees.size() && !model_ext.hplanes.size())
            throw std::runtime_error("Error: model contains no trees.\n");

        size_t ntrees;
        size_t ndim = 3;
        bool build_imputer = false;

        if (!model.trees.empty()) {
            ntrees = model.trees.size();
            ndim = 1;
        }
        else {
            ntrees = model_ext.hplanes.size();
        }
        if (!imputer.imputer_tree.empty()) {
            if (imputer.imputer_tree.size() != ntrees)
                throw std::runtime_error("Error: imputer has incorrect number of trees.\n");
            build_imputer = true;
        }
        if (!indexer.indices.empty()) {
            if (indexer.indices.size() != ntrees)
                throw std::runtime_error("Error: indexer has incorrect number of trees.\n");
        }

        std::unique_ptr<IsolationForest> out(new IsolationForest());
        out->nthreads = nthreads;
        out->ndim = ndim;
        out->ntrees = ntrees;
        out->build_imputer = build_imputer;

        if (!model.trees.empty())
            out->get_model() = std::move(model);
        else
            out->get_model_ext() = std::move(model_ext);
        if (!imputer.imputer_tree.empty())
            out->get_imputer() = std::move(imputer);
        if (!indexer.indices.empty())
            out->indexer = std::move(indexer);

        return out.release();
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
        return nullptr;
    }
}